

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_no_fut.cc
# Opt level: O2

void hello(int a,int b,int c)

{
  ostream *poVar1;
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,a);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,b);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,c);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

static void hello(int a, int b, int c)
{
    std::cout << a << ' ' << b << ' ' << c << '\n';
}